

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O0

void __thiscall RootIndexProxyModel::fetchMore(RootIndexProxyModel *this,QModelIndex *parent)

{
  bool bVar1;
  long lVar2;
  long *plVar3;
  QPersistentModelIndex local_68;
  QModelIndex local_60;
  undefined1 local_48 [24];
  QModelIndex sourceParent;
  RootIndexProxyModelPrivate *d;
  QModelIndex *parent_local;
  RootIndexProxyModel *this_local;
  
  lVar2 = QAbstractProxyModel::sourceModel();
  if (lVar2 != 0) {
    sourceParent.m = (QAbstractItemModel *)d_func(this);
    QModelIndex::QModelIndex((QModelIndex *)(local_48 + 0x10));
    bVar1 = QModelIndex::isValid(parent);
    if (bVar1) {
      (**(code **)(*(long *)this + 400))(&local_60.m,this,parent);
      local_48._16_8_ = local_60.m;
      sourceParent.r = local_48._0_4_;
      sourceParent.c = local_48._4_4_;
      sourceParent.i = local_48._8_8_;
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_68);
      local_48._16_8_ = local_68.d;
      sourceParent.r = local_60.r;
      sourceParent.c = local_60.c;
      sourceParent.i = local_60.i;
    }
    plVar3 = (long *)QAbstractProxyModel::sourceModel();
    (**(code **)(*plVar3 + 0x128))(plVar3,local_48 + 0x10);
  }
  return;
}

Assistant:

void RootIndexProxyModel::fetchMore(const QModelIndex &parent)
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (!sourceModel())
        return;
    Q_D(RootIndexProxyModel);
    QModelIndex sourceParent;
    if (parent.isValid())
        sourceParent = mapToSource(parent);
    else
        sourceParent = d->m_rootIndex;
    sourceModel()->fetchMore(sourceParent);
}